

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_iplusn(LispPTR tos,int n)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  float *pfVar4;
  uint *NAddr;
  uint uVar5;
  
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar2 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    LVar2 = tos & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar4 = (float *)NativeAligned4FromLAddr(tos);
      if (*pfVar4 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      LVar2 = (LispPTR)*pfVar4;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar3 = NativeAligned4FromLAddr(tos);
      LVar2 = *pLVar3;
    }
  }
  uVar5 = LVar2 + n;
  if (SCARRY4(LVar2,n)) {
    MachineState.errorexit = 1;
    MachineState.tosvalue = tos;
    return 0xffffffff;
  }
  if ((uVar5 & 0xffff0000) == 0xffff0000) {
    return uVar5 & 0xffff | 0xf0000;
  }
  if ((uVar5 & 0xffff0000) != 0) {
    NAddr = (uint *)createcell68k(2);
    *NAddr = uVar5;
    LVar2 = LAddrFromNative(NAddr);
    return LVar2;
  }
  return uVar5 | 0xe0000;
}

Assistant:

LispPTR N_OP_iplusn(LispPTR tos, int n) {
  int arg1;
  int result;

  N_IGETNUMBER(tos, arg1, do_ufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_sadd_overflow(arg1, n, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else

  result = arg1 + n;
  if ((result < 0) && (arg1 >= 0)) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif

do_ufn:
  ERROR_EXIT(tos);
}